

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

QRhiRenderTarget * __thiscall
QGles2SwapChain::currentFrameRenderTarget(QGles2SwapChain *this,StereoTargetBuffer targetBuffer)

{
  bool bVar1;
  int in_ESI;
  long in_RDI;
  QRhiRenderTarget *local_30;
  QRhiRenderTarget *local_28;
  QRhiRenderTarget *local_8;
  
  if (in_ESI == 0) {
    bVar1 = QGles2RenderTargetData::isValid((QGles2RenderTargetData *)(in_RDI + 0x260));
    if (bVar1) {
      local_28 = (QRhiRenderTarget *)(in_RDI + 0x220);
    }
    else {
      local_28 = (QRhiRenderTarget *)(in_RDI + 0x88);
    }
    local_8 = local_28;
  }
  else if (in_ESI == 1) {
    bVar1 = QGles2RenderTargetData::isValid((QGles2RenderTargetData *)(in_RDI + 0x3f8));
    if (bVar1) {
      local_30 = (QRhiRenderTarget *)(in_RDI + 0x3b8);
    }
    else {
      local_30 = (QRhiRenderTarget *)(in_RDI + 0x88);
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

QRhiRenderTarget *QGles2SwapChain::currentFrameRenderTarget(StereoTargetBuffer targetBuffer)
{
    if (targetBuffer == LeftBuffer)
        return rtLeft.d.isValid() ? &rtLeft : &rt;
    else if (targetBuffer == RightBuffer)
        return rtRight.d.isValid() ? &rtRight : &rt;
    else
        Q_UNREACHABLE_RETURN(nullptr);
}